

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O2

void idct32_low16_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  __m256i alVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  __m256i cospim32;
  __m256i clamp_hi;
  __m256i clamp_lo;
  __m256i cospim16;
  __m256i cospi16;
  __m256i cospim48;
  __m256i cospi48;
  __m256i cospi32;
  __m256i rounding;
  __m256i cospim24;
  __m256i cospim56;
  __m256i cospi40;
  __m256i cospi24;
  __m256i cospim8;
  __m256i cospim40;
  __m256i cospi8;
  __m256i cospi56;
  int bit_00;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  int local_780;
  int iStack_77c;
  int iStack_778;
  int iStack_774;
  int iStack_770;
  int iStack_76c;
  int iStack_768;
  int iStack_764;
  undefined1 local_750 [16];
  __m256i local_740;
  int local_720;
  int iStack_71c;
  int iStack_718;
  int iStack_714;
  int iStack_710;
  int iStack_70c;
  int iStack_708;
  int iStack_704;
  int local_700;
  int iStack_6fc;
  int iStack_6f8;
  int iStack_6f4;
  int iStack_6f0;
  int iStack_6ec;
  int iStack_6e8;
  int iStack_6e4;
  int local_6e0;
  int iStack_6dc;
  int iStack_6d8;
  int iStack_6d4;
  int iStack_6d0;
  int iStack_6cc;
  int iStack_6c8;
  int iStack_6c4;
  int local_6c0;
  int iStack_6bc;
  int iStack_6b8;
  int iStack_6b4;
  int iStack_6b0;
  int iStack_6ac;
  int iStack_6a8;
  int iStack_6a4;
  int local_6a0;
  int iStack_69c;
  int iStack_698;
  int iStack_694;
  int iStack_690;
  int iStack_68c;
  int iStack_688;
  int iStack_684;
  int local_680;
  int iStack_67c;
  int iStack_678;
  int iStack_674;
  int iStack_670;
  int iStack_66c;
  int iStack_668;
  int iStack_664;
  __m256i local_660;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  __m256i local_580;
  int local_560;
  int iStack_55c;
  int iStack_558;
  int iStack_554;
  int iStack_550;
  int iStack_54c;
  int iStack_548;
  int iStack_544;
  int local_540;
  int iStack_53c;
  int iStack_538;
  int iStack_534;
  int iStack_530;
  int iStack_52c;
  int iStack_528;
  int iStack_524;
  int local_520;
  int iStack_51c;
  int iStack_518;
  int iStack_514;
  int iStack_510;
  int iStack_50c;
  int iStack_508;
  int iStack_504;
  int local_500;
  int iStack_4fc;
  int iStack_4f8;
  int iStack_4f4;
  int iStack_4f0;
  int iStack_4ec;
  int iStack_4e8;
  int iStack_4e4;
  int local_4e0;
  int iStack_4dc;
  int iStack_4d8;
  int iStack_4d4;
  int iStack_4d0;
  int iStack_4cc;
  int iStack_4c8;
  int iStack_4c4;
  int local_4c0;
  int iStack_4bc;
  int iStack_4b8;
  int iStack_4b4;
  int iStack_4b0;
  int iStack_4ac;
  int iStack_4a8;
  int iStack_4a4;
  int local_4a0;
  int iStack_49c;
  int iStack_498;
  int iStack_494;
  int iStack_490;
  int iStack_48c;
  int iStack_488;
  int iStack_484;
  int local_480;
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  __m256i local_460;
  __m256i local_440;
  __m256i local_420;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  lVar19 = (long)bit * 0x100;
  iVar10 = -*(int *)((long)vert_filter_length_chroma + lVar19 + 0x248);
  iVar11 = -*(int *)((long)vert_filter_length_chroma + lVar19 + 0x208);
  iVar12 = -*(int *)((long)vert_filter_length_chroma + lVar19 + 0x228);
  iVar13 = -*(int *)((long)vert_filter_length_chroma + lVar19 + 0x1e8);
  iVar14 = -*(int *)((long)vert_filter_length_chroma + lVar19 + 0x230);
  iVar15 = -*(int *)((long)vert_filter_length_chroma + lVar19 + 0x1f0);
  local_480 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x240);
  local_500 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x1c0);
  local_520 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x200);
  local_4a0 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x180);
  local_4c0 = -local_520;
  local_4e0 = -local_4a0;
  local_540 = -local_480;
  local_560 = -local_500;
  local_680 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x1e0);
  local_780 = -local_680;
  local_6a0 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x220);
  local_6c0 = -local_6a0;
  local_6e0 = *(int *)((long)vert_filter_length_chroma + lVar19 + 0x1a0);
  local_700 = -local_6e0;
  bit_00 = 1;
  iVar18 = 1 << ((char)bit - 1U & 0x1f);
  iVar16 = bd + (uint)(do_cols == 0) * 2;
  iVar17 = 0x8000;
  if (0xf < iVar16 + 6) {
    iVar17 = 1 << ((char)iVar16 + 5U & 0x1f);
  }
  local_800._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 600);
  local_800._0_4_ = local_800._4_4_;
  local_800._8_4_ = local_800._4_4_;
  local_800._12_4_ = local_800._4_4_;
  local_800._16_4_ = local_800._4_4_;
  local_800._20_4_ = local_800._4_4_;
  local_800._24_4_ = local_800._4_4_;
  local_800._28_4_ = local_800._4_4_;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x1d8);
  auVar41._4_4_ = uVar1;
  auVar41._0_4_ = uVar1;
  auVar41._8_4_ = uVar1;
  auVar41._12_4_ = uVar1;
  auVar41._16_4_ = uVar1;
  auVar41._20_4_ = uVar1;
  auVar41._24_4_ = uVar1;
  auVar41._28_4_ = uVar1;
  local_860._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x218);
  local_860._0_4_ = local_860._4_4_;
  local_860._8_4_ = local_860._4_4_;
  local_860._12_4_ = local_860._4_4_;
  local_860._16_4_ = local_860._4_4_;
  local_860._20_4_ = local_860._4_4_;
  local_860._24_4_ = local_860._4_4_;
  local_860._28_4_ = local_860._4_4_;
  local_840._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x198);
  local_840._0_4_ = local_840._4_4_;
  local_840._8_4_ = local_840._4_4_;
  local_840._12_4_ = local_840._4_4_;
  local_840._16_4_ = local_840._4_4_;
  local_840._20_4_ = local_840._4_4_;
  local_840._24_4_ = local_840._4_4_;
  local_840._28_4_ = local_840._4_4_;
  local_820._4_4_ = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x238);
  local_820._0_4_ = local_820._4_4_;
  local_820._8_4_ = local_820._4_4_;
  local_820._12_4_ = local_820._4_4_;
  local_820._16_4_ = local_820._4_4_;
  local_820._20_4_ = local_820._4_4_;
  local_820._24_4_ = local_820._4_4_;
  local_820._28_4_ = local_820._4_4_;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x1b8);
  auVar29._4_4_ = uVar1;
  auVar29._0_4_ = uVar1;
  auVar29._8_4_ = uVar1;
  auVar29._12_4_ = uVar1;
  auVar29._16_4_ = uVar1;
  auVar29._20_4_ = uVar1;
  auVar29._24_4_ = uVar1;
  auVar29._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x1c8);
  auVar34._4_4_ = uVar1;
  auVar34._0_4_ = uVar1;
  auVar34._8_4_ = uVar1;
  auVar34._12_4_ = uVar1;
  auVar34._16_4_ = uVar1;
  auVar34._20_4_ = uVar1;
  auVar34._24_4_ = uVar1;
  auVar34._28_4_ = uVar1;
  local_720 = -iVar17;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x188);
  auVar26._4_4_ = uVar1;
  auVar26._0_4_ = uVar1;
  auVar26._8_4_ = uVar1;
  auVar26._12_4_ = uVar1;
  auVar26._16_4_ = uVar1;
  auVar26._20_4_ = uVar1;
  auVar26._24_4_ = uVar1;
  auVar26._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x1a8);
  auVar24._4_4_ = uVar1;
  auVar24._0_4_ = uVar1;
  auVar24._8_4_ = uVar1;
  auVar24._12_4_ = uVar1;
  auVar24._16_4_ = uVar1;
  auVar24._20_4_ = uVar1;
  auVar24._24_4_ = uVar1;
  auVar24._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x168);
  auVar40._4_4_ = uVar1;
  auVar40._0_4_ = uVar1;
  auVar40._8_4_ = uVar1;
  auVar40._12_4_ = uVar1;
  auVar40._16_4_ = uVar1;
  auVar40._20_4_ = uVar1;
  auVar40._24_4_ = uVar1;
  auVar40._28_4_ = uVar1;
  iVar17 = iVar17 + -1;
  auVar39._4_4_ = iVar11;
  auVar39._0_4_ = iVar11;
  auVar39._8_4_ = iVar11;
  auVar39._12_4_ = iVar11;
  auVar39._16_4_ = iVar11;
  auVar39._20_4_ = iVar11;
  auVar39._24_4_ = iVar11;
  auVar39._28_4_ = iVar11;
  auVar25._4_4_ = iVar12;
  auVar25._0_4_ = iVar12;
  auVar25._8_4_ = iVar12;
  auVar25._12_4_ = iVar12;
  auVar25._16_4_ = iVar12;
  auVar25._20_4_ = iVar12;
  auVar25._24_4_ = iVar12;
  auVar25._28_4_ = iVar12;
  auVar20._4_4_ = iVar13;
  auVar20._0_4_ = iVar13;
  auVar20._8_4_ = iVar13;
  auVar20._12_4_ = iVar13;
  auVar20._16_4_ = iVar13;
  auVar20._20_4_ = iVar13;
  auVar20._24_4_ = iVar13;
  auVar20._28_4_ = iVar13;
  local_660[0]._4_4_ = iVar18;
  local_660[0]._0_4_ = iVar18;
  local_660[1]._0_4_ = iVar18;
  local_660[1]._4_4_ = iVar18;
  local_660[2]._0_4_ = iVar18;
  local_660[2]._4_4_ = iVar18;
  local_660[3]._0_4_ = iVar18;
  local_660[3]._4_4_ = iVar18;
  alVar28[0]._4_4_ = iVar17;
  alVar28[0]._0_4_ = iVar17;
  alVar28[1]._0_4_ = iVar17;
  alVar28[1]._4_4_ = iVar17;
  alVar28[2]._0_4_ = iVar17;
  alVar28[2]._4_4_ = iVar17;
  alVar28[3]._0_4_ = iVar17;
  alVar28[3]._4_4_ = iVar17;
  local_460 = *in;
  local_420 = in[8];
  auVar2 = vpmulld_avx2(auVar40,(undefined1  [32])in[1]);
  auVar3 = vpmulld_avx2((undefined1  [32])in[1],local_800);
  auVar4 = vpmulld_avx2(auVar20,(undefined1  [32])in[0xf]);
  auVar5 = vpmulld_avx2(auVar41,(undefined1  [32])in[0xf]);
  local_5a0 = vpmulld_avx2(auVar24,(undefined1  [32])in[9]);
  auVar20 = vpmulld_avx2((undefined1  [32])in[9],local_860);
  auVar6 = vpmulld_avx2(auVar25,(undefined1  [32])in[7]);
  auVar7 = vpmulld_avx2((undefined1  [32])in[7],local_840);
  local_5e0 = vpmulld_avx2(auVar26,(undefined1  [32])in[5]);
  auVar8 = vpmulld_avx2((undefined1  [32])in[5],local_820);
  auVar24 = vpmulld_avx2(auVar39,(undefined1  [32])in[0xb]);
  local_600 = vpmulld_avx2(auVar29,(undefined1  [32])in[0xb]);
  auVar25 = vpmulld_avx2(auVar34,(undefined1  [32])in[0xd]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x1f8);
  auVar27._4_4_ = uVar1;
  auVar27._0_4_ = uVar1;
  auVar27._8_4_ = uVar1;
  auVar27._12_4_ = uVar1;
  auVar27._16_4_ = uVar1;
  auVar27._20_4_ = uVar1;
  auVar27._24_4_ = uVar1;
  auVar27._28_4_ = uVar1;
  auVar26 = vpmulld_avx2(auVar27,(undefined1  [32])in[0xd]);
  auVar23._4_4_ = iVar10;
  auVar23._0_4_ = iVar10;
  auVar23._8_4_ = iVar10;
  auVar23._12_4_ = iVar10;
  auVar23._16_4_ = iVar10;
  auVar23._20_4_ = iVar10;
  auVar23._24_4_ = iVar10;
  auVar23._28_4_ = iVar10;
  auVar23 = vpmulld_avx2(auVar23,(undefined1  [32])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x178);
  auVar35._4_4_ = uVar1;
  auVar35._0_4_ = uVar1;
  auVar35._8_4_ = uVar1;
  auVar35._12_4_ = uVar1;
  auVar35._16_4_ = uVar1;
  auVar35._20_4_ = uVar1;
  auVar35._24_4_ = uVar1;
  auVar35._28_4_ = uVar1;
  auVar27 = vpmulld_avx2(auVar35,(undefined1  [32])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x170);
  auVar30._4_4_ = uVar1;
  auVar30._0_4_ = uVar1;
  auVar30._8_4_ = uVar1;
  auVar30._12_4_ = uVar1;
  auVar30._16_4_ = uVar1;
  auVar30._20_4_ = uVar1;
  auVar30._24_4_ = uVar1;
  auVar30._28_4_ = uVar1;
  auVar29 = vpmulld_avx2((undefined1  [32])in[2],auVar30);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x250);
  auVar31._4_4_ = uVar1;
  auVar31._0_4_ = uVar1;
  auVar31._8_4_ = uVar1;
  auVar31._12_4_ = uVar1;
  auVar31._16_4_ = uVar1;
  auVar31._20_4_ = uVar1;
  auVar31._24_4_ = uVar1;
  auVar31._28_4_ = uVar1;
  local_620 = vpmulld_avx2((undefined1  [32])in[2],auVar31);
  auVar32._4_4_ = iVar15;
  auVar32._0_4_ = iVar15;
  auVar32._8_4_ = iVar15;
  auVar32._12_4_ = iVar15;
  auVar32._16_4_ = iVar15;
  auVar32._20_4_ = iVar15;
  auVar32._24_4_ = iVar15;
  auVar32._28_4_ = iVar15;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x1d0);
  auVar36._4_4_ = uVar1;
  auVar36._0_4_ = uVar1;
  auVar36._8_4_ = uVar1;
  auVar36._12_4_ = uVar1;
  auVar36._16_4_ = uVar1;
  auVar36._20_4_ = uVar1;
  auVar36._24_4_ = uVar1;
  auVar36._28_4_ = uVar1;
  local_640 = vpmulld_avx2((undefined1  [32])in[0xe],auVar32);
  auVar30 = vpmulld_avx2((undefined1  [32])in[0xe],auVar36);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x1b0);
  auVar21._4_4_ = uVar1;
  auVar21._0_4_ = uVar1;
  auVar21._8_4_ = uVar1;
  auVar21._12_4_ = uVar1;
  auVar21._16_4_ = uVar1;
  auVar21._20_4_ = uVar1;
  auVar21._24_4_ = uVar1;
  auVar21._28_4_ = uVar1;
  auVar21 = vpmulld_avx2((undefined1  [32])in[10],auVar21);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 0x210);
  auVar22._4_4_ = uVar1;
  auVar22._0_4_ = uVar1;
  auVar22._8_4_ = uVar1;
  auVar22._12_4_ = uVar1;
  auVar22._16_4_ = uVar1;
  auVar22._20_4_ = uVar1;
  auVar22._24_4_ = uVar1;
  auVar22._28_4_ = uVar1;
  local_5c0 = vpmulld_avx2((undefined1  [32])in[10],auVar22);
  auVar37._4_4_ = iVar14;
  auVar37._0_4_ = iVar14;
  auVar37._8_4_ = iVar14;
  auVar37._12_4_ = iVar14;
  auVar37._16_4_ = iVar14;
  auVar37._20_4_ = iVar14;
  auVar37._24_4_ = iVar14;
  auVar37._28_4_ = iVar14;
  auVar22 = vpmulld_avx2((undefined1  [32])in[6],auVar37);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar19 + 400);
  auVar33._4_4_ = uVar1;
  auVar33._0_4_ = uVar1;
  auVar33._8_4_ = uVar1;
  auVar33._12_4_ = uVar1;
  auVar33._16_4_ = uVar1;
  auVar33._20_4_ = uVar1;
  auVar33._24_4_ = uVar1;
  auVar33._28_4_ = uVar1;
  auVar31 = vpmulld_avx2((undefined1  [32])in[6],auVar33);
  auVar3 = vpaddd_avx2(auVar3,(undefined1  [32])local_660);
  auVar9 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar3 = vpaddd_avx2(auVar4,(undefined1  [32])local_660);
  auVar4 = vpsrad_avx2(auVar3,ZEXT416((uint)bit));
  auVar3 = vpaddd_avx2(auVar4,auVar9);
  auVar4 = vpsubd_avx2(auVar9,auVar4);
  auVar9._4_4_ = local_720;
  auVar9._0_4_ = local_720;
  auVar9._8_4_ = local_720;
  auVar9._12_4_ = local_720;
  auVar9._16_4_ = local_720;
  auVar9._20_4_ = local_720;
  auVar9._24_4_ = local_720;
  auVar9._28_4_ = local_720;
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_260 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar4,auVar9);
  local_240 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(auVar20,(undefined1  [32])local_660);
  auVar38 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2(auVar6,(undefined1  [32])local_660);
  auVar20 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpsubd_avx2(auVar20,auVar4);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_200 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar8);
  auVar4 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpmaxsd_avx2(auVar20,auVar9);
  local_220 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(auVar24,(undefined1  [32])local_660);
  auVar20 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2(auVar20,auVar4);
  auVar4 = vpsubd_avx2(auVar4,auVar20);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_1e0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar4,auVar9);
  local_1c0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar26);
  auVar38 = ZEXT416((uint)bit);
  auVar4 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar23);
  auVar20 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpsubd_avx2(auVar20,auVar4);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_180 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(auVar25,(undefined1  [32])local_660);
  auVar4 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpmaxsd_avx2(auVar20,auVar9);
  local_1a0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(auVar27,(undefined1  [32])local_660);
  auVar20 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2(auVar20,auVar4);
  auVar4 = vpsubd_avx2(auVar20,auVar4);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_160 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar4,auVar9);
  local_140 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,local_5e0);
  auVar4 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,local_600);
  auVar20 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2(auVar20,auVar4);
  auVar20 = vpsubd_avx2(auVar4,auVar20);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_100 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar2);
  auVar4 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpmaxsd_avx2(auVar20,auVar9);
  local_120 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,local_5a0);
  auVar2 = vpsrad_avx2(auVar3,auVar38);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar7);
  local_750 = ZEXT416((uint)bit);
  auVar20 = vpsrad_avx2(auVar3,local_750);
  auVar3 = vpaddd_avx2(auVar20,auVar2);
  auVar6 = vpsubd_avx2(auVar20,auVar2);
  auVar2 = vpaddd_avx2((undefined1  [32])local_660,auVar5);
  auVar5 = vpsrad_avx2(auVar2,local_750);
  auVar2 = vpaddd_avx2((undefined1  [32])local_660,local_620);
  auVar20 = vpsrad_avx2(auVar2,local_750);
  auVar2 = vpaddd_avx2((undefined1  [32])local_660,local_640);
  auVar2 = vpsrad_avx2(auVar2,local_750);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_e0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar6,auVar9);
  local_c0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(auVar5,auVar4);
  auVar4 = vpsubd_avx2(auVar4,auVar5);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_80 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar4,auVar9);
  local_a0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar7._4_4_ = local_4a0;
  auVar7._0_4_ = local_4a0;
  auVar7._8_4_ = local_4a0;
  auVar7._12_4_ = local_4a0;
  auVar7._16_4_ = local_4a0;
  auVar7._20_4_ = local_4a0;
  auVar7._24_4_ = local_4a0;
  auVar7._28_4_ = local_4a0;
  auVar3 = vpmulld_avx2((undefined1  [32])in[4],auVar7);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar3);
  local_380 = vpsrad_avx2(auVar3,local_750);
  auVar8._4_4_ = local_480;
  auVar8._0_4_ = local_480;
  auVar8._8_4_ = local_480;
  auVar8._12_4_ = local_480;
  auVar8._16_4_ = local_480;
  auVar8._20_4_ = local_480;
  auVar8._24_4_ = local_480;
  auVar8._28_4_ = local_480;
  auVar3 = vpmulld_avx2((undefined1  [32])in[4],auVar8);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar3);
  local_3e0 = vpsrad_avx2(auVar3,local_750);
  auVar6._4_4_ = local_4c0;
  auVar6._0_4_ = local_4c0;
  auVar6._8_4_ = local_4c0;
  auVar6._12_4_ = local_4c0;
  auVar6._16_4_ = local_4c0;
  auVar6._20_4_ = local_4c0;
  auVar6._24_4_ = local_4c0;
  auVar6._28_4_ = local_4c0;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xc],auVar6);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar3);
  local_3c0 = vpsrad_avx2(auVar3,local_750);
  auVar5._4_4_ = local_500;
  auVar5._0_4_ = local_500;
  auVar5._8_4_ = local_500;
  auVar5._12_4_ = local_500;
  auVar5._16_4_ = local_500;
  auVar5._20_4_ = local_500;
  auVar5._24_4_ = local_500;
  auVar5._28_4_ = local_500;
  auVar3 = vpmulld_avx2((undefined1  [32])in[0xc],auVar5);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar3);
  local_3a0 = vpsrad_avx2(auVar3,local_750);
  auVar3 = vpaddd_avx2(auVar2,auVar20);
  auVar5 = vpsubd_avx2(auVar20,auVar2);
  auVar2 = vpaddd_avx2((undefined1  [32])local_660,local_5c0);
  auVar4 = vpsrad_avx2(auVar2,local_750);
  auVar2 = vpaddd_avx2(auVar22,(undefined1  [32])local_660);
  auVar2 = vpsrad_avx2(auVar2,local_750);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_360 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar5,auVar9);
  local_340 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(auVar2,auVar4);
  auVar5 = vpsubd_avx2(auVar2,auVar4);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_300 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar21);
  auVar2 = vpsrad_avx2(auVar3,local_750);
  auVar3 = vpaddd_avx2((undefined1  [32])local_660,auVar31);
  auVar4 = vpsrad_avx2(auVar3,local_750);
  auVar3 = vpmaxsd_avx2(auVar5,auVar9);
  local_320 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(auVar4,auVar2);
  auVar5 = vpsubd_avx2(auVar4,auVar2);
  auVar2 = vpaddd_avx2((undefined1  [32])local_660,auVar29);
  auVar4 = vpsrad_avx2(auVar2,local_750);
  auVar2 = vpaddd_avx2((undefined1  [32])local_660,auVar30);
  auVar2 = vpsrad_avx2(auVar2,local_750);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_2e0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar5,auVar9);
  local_2c0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(auVar2,auVar4);
  auVar2 = vpsubd_avx2(auVar4,auVar2);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_280 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar2,auVar9);
  local_2a0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  iStack_77c = local_780;
  iStack_778 = local_780;
  iStack_774 = local_780;
  iStack_770 = local_780;
  iStack_76c = local_780;
  iStack_768 = local_780;
  iStack_764 = local_780;
  local_740 = alVar28;
  iStack_71c = local_720;
  iStack_718 = local_720;
  iStack_714 = local_720;
  iStack_710 = local_720;
  iStack_70c = local_720;
  iStack_708 = local_720;
  iStack_704 = local_720;
  iStack_6fc = local_700;
  iStack_6f8 = local_700;
  iStack_6f4 = local_700;
  iStack_6f0 = local_700;
  iStack_6ec = local_700;
  iStack_6e8 = local_700;
  iStack_6e4 = local_700;
  iStack_6dc = local_6e0;
  iStack_6d8 = local_6e0;
  iStack_6d4 = local_6e0;
  iStack_6d0 = local_6e0;
  iStack_6cc = local_6e0;
  iStack_6c8 = local_6e0;
  iStack_6c4 = local_6e0;
  iStack_6bc = local_6c0;
  iStack_6b8 = local_6c0;
  iStack_6b4 = local_6c0;
  iStack_6b0 = local_6c0;
  iStack_6ac = local_6c0;
  iStack_6a8 = local_6c0;
  iStack_6a4 = local_6c0;
  iStack_69c = local_6a0;
  iStack_698 = local_6a0;
  iStack_694 = local_6a0;
  iStack_690 = local_6a0;
  iStack_68c = local_6a0;
  iStack_688 = local_6a0;
  iStack_684 = local_6a0;
  iStack_67c = local_680;
  iStack_678 = local_680;
  iStack_674 = local_680;
  iStack_670 = local_680;
  iStack_66c = local_680;
  iStack_668 = local_680;
  iStack_664 = local_680;
  local_580 = local_660;
  iStack_55c = local_560;
  iStack_558 = local_560;
  iStack_554 = local_560;
  iStack_550 = local_560;
  iStack_54c = local_560;
  iStack_548 = local_560;
  iStack_544 = local_560;
  iStack_53c = local_540;
  iStack_538 = local_540;
  iStack_534 = local_540;
  iStack_530 = local_540;
  iStack_52c = local_540;
  iStack_528 = local_540;
  iStack_524 = local_540;
  iStack_51c = local_520;
  iStack_518 = local_520;
  iStack_514 = local_520;
  iStack_510 = local_520;
  iStack_50c = local_520;
  iStack_508 = local_520;
  iStack_504 = local_520;
  iStack_4fc = local_500;
  iStack_4f8 = local_500;
  iStack_4f4 = local_500;
  iStack_4f0 = local_500;
  iStack_4ec = local_500;
  iStack_4e8 = local_500;
  iStack_4e4 = local_500;
  iStack_4dc = local_4e0;
  iStack_4d8 = local_4e0;
  iStack_4d4 = local_4e0;
  iStack_4d0 = local_4e0;
  iStack_4cc = local_4e0;
  iStack_4c8 = local_4e0;
  iStack_4c4 = local_4e0;
  iStack_4bc = local_4c0;
  iStack_4b8 = local_4c0;
  iStack_4b4 = local_4c0;
  iStack_4b0 = local_4c0;
  iStack_4ac = local_4c0;
  iStack_4a8 = local_4c0;
  iStack_4a4 = local_4c0;
  iStack_49c = local_4a0;
  iStack_498 = local_4a0;
  iStack_494 = local_4a0;
  iStack_490 = local_4a0;
  iStack_48c = local_4a0;
  iStack_488 = local_4a0;
  iStack_484 = local_4a0;
  iStack_47c = local_480;
  iStack_478 = local_480;
  iStack_474 = local_480;
  iStack_470 = local_480;
  iStack_46c = local_480;
  iStack_468 = local_480;
  iStack_464 = local_480;
  idct32_stage4_avx2(&local_460,(__m256i *)&local_4e0,(__m256i *)&local_480,(__m256i *)&local_4a0,
                     (__m256i *)&local_540,(__m256i *)&local_4c0,(__m256i *)&local_500,
                     (__m256i *)&local_520,(__m256i *)&local_560,&local_580,bit);
  auVar4._4_4_ = iStack_67c;
  auVar4._0_4_ = local_680;
  auVar4._8_4_ = iStack_678;
  auVar4._12_4_ = iStack_674;
  auVar4._16_4_ = iStack_670;
  auVar4._20_4_ = iStack_66c;
  auVar4._24_4_ = iStack_668;
  auVar4._28_4_ = iStack_664;
  auVar3 = vpmulld_avx2((undefined1  [32])local_460,auVar4);
  auVar3 = vpaddd_avx2(auVar3,(undefined1  [32])local_660);
  local_460 = (__m256i)vpsrad_avx2(auVar3,local_750);
  auVar3._4_4_ = iStack_6dc;
  auVar3._0_4_ = local_6e0;
  auVar3._8_4_ = iStack_6d8;
  auVar3._12_4_ = iStack_6d4;
  auVar3._16_4_ = iStack_6d0;
  auVar3._20_4_ = iStack_6cc;
  auVar3._24_4_ = iStack_6c8;
  auVar3._28_4_ = iStack_6c4;
  auVar3 = vpmulld_avx2((undefined1  [32])local_420,auVar3);
  auVar3 = vpaddd_avx2(auVar3,(undefined1  [32])local_660);
  local_400 = vpsrad_avx2(auVar3,local_750);
  auVar2._4_4_ = iStack_69c;
  auVar2._0_4_ = local_6a0;
  auVar2._8_4_ = iStack_698;
  auVar2._12_4_ = iStack_694;
  auVar2._16_4_ = iStack_690;
  auVar2._20_4_ = iStack_68c;
  auVar2._24_4_ = iStack_688;
  auVar2._28_4_ = iStack_684;
  auVar3 = vpmulld_avx2((undefined1  [32])local_420,auVar2);
  auVar3 = vpaddd_avx2(auVar3,(undefined1  [32])local_660);
  local_420 = (__m256i)vpsrad_avx2(auVar3,local_750);
  auVar3 = vpaddd_avx2(local_3c0,local_3e0);
  auVar2 = vpsubd_avx2(local_3e0,local_3c0);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_3e0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar2,auVar9);
  local_3c0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2(local_3a0,local_380);
  auVar2 = vpsubd_avx2(local_380,local_3a0);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_380 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar2,auVar9);
  local_3a0 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  local_440 = local_460;
  idct32_stage5_avx2(&local_460,(__m256i *)&local_700,(__m256i *)&local_6a0,(__m256i *)&local_6e0,
                     (__m256i *)&local_6c0,(__m256i *)&local_720,&local_740,&local_580,bit);
  auVar3 = vpaddd_avx2(local_400,(undefined1  [32])local_460);
  auVar2 = vpsubd_avx2((undefined1  [32])local_460,local_400);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_460 = (__m256i)vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar2,auVar9);
  local_400 = vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpaddd_avx2((undefined1  [32])local_420,(undefined1  [32])local_440);
  auVar2 = vpsubd_avx2((undefined1  [32])local_440,(undefined1  [32])local_420);
  auVar3 = vpmaxsd_avx2(auVar3,auVar9);
  local_440 = (__m256i)vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  auVar3 = vpmaxsd_avx2(auVar2,auVar9);
  local_420 = (__m256i)vpminsd_avx2(auVar3,(undefined1  [32])alVar28);
  idct32_stage6_avx2(&local_460,(__m256i *)&local_780,(__m256i *)&local_680,(__m256i *)&local_700,
                     (__m256i *)&local_6a0,(__m256i *)&local_6e0,(__m256i *)&local_720,&local_740,
                     &local_580,(__m256i *)(long)bit,bit_00);
  idct32_stage7_avx2(&local_460,(__m256i *)&local_780,(__m256i *)&local_680,(__m256i *)&local_720,
                     &local_740,&local_580,bit);
  idct32_stage8_avx2(&local_460,(__m256i *)&local_780,(__m256i *)&local_680,(__m256i *)&local_720,
                     &local_740,&local_580,bit);
  idct32_stage9_avx2(&local_460,out,do_cols,bd,out_shift,(__m256i *)&local_720,&local_740);
  return;
}

Assistant:

static void idct32_low16_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                              int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi62 = _mm256_set1_epi32(cospi[62]);
  const __m256i cospi30 = _mm256_set1_epi32(cospi[30]);
  const __m256i cospi46 = _mm256_set1_epi32(cospi[46]);
  const __m256i cospi14 = _mm256_set1_epi32(cospi[14]);
  const __m256i cospi54 = _mm256_set1_epi32(cospi[54]);
  const __m256i cospi22 = _mm256_set1_epi32(cospi[22]);
  const __m256i cospi38 = _mm256_set1_epi32(cospi[38]);
  const __m256i cospi6 = _mm256_set1_epi32(cospi[6]);
  const __m256i cospi26 = _mm256_set1_epi32(cospi[26]);
  const __m256i cospi10 = _mm256_set1_epi32(cospi[10]);
  const __m256i cospi18 = _mm256_set1_epi32(cospi[18]);
  const __m256i cospi2 = _mm256_set1_epi32(cospi[2]);
  const __m256i cospim58 = _mm256_set1_epi32(-cospi[58]);
  const __m256i cospim42 = _mm256_set1_epi32(-cospi[42]);
  const __m256i cospim50 = _mm256_set1_epi32(-cospi[50]);
  const __m256i cospim34 = _mm256_set1_epi32(-cospi[34]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospim52 = _mm256_set1_epi32(-cospi[52]);
  const __m256i cospim36 = _mm256_set1_epi32(-cospi[36]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospim40 = _mm256_set1_epi32(-cospi[40]);
  const __m256i cospim8 = _mm256_set1_epi32(-cospi[8]);
  const __m256i cospim56 = _mm256_set1_epi32(-cospi[56]);
  const __m256i cospim24 = _mm256_set1_epi32(-cospi[24]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i rounding = _mm256_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m256i clamp_lo = _mm256_set1_epi32(-(1 << (log_range - 1)));
  const __m256i clamp_hi = _mm256_set1_epi32((1 << (log_range - 1)) - 1);
  __m256i bf1[32];

  {
    // stage 0
    // stage 1
    bf1[0] = in[0];
    bf1[2] = in[8];
    bf1[4] = in[4];
    bf1[6] = in[12];
    bf1[8] = in[2];
    bf1[10] = in[10];
    bf1[12] = in[6];
    bf1[14] = in[14];
    bf1[16] = in[1];
    bf1[18] = in[9];
    bf1[20] = in[5];
    bf1[22] = in[13];
    bf1[24] = in[3];
    bf1[26] = in[11];
    bf1[28] = in[7];
    bf1[30] = in[15];

    // stage 2
    bf1[31] = half_btf_0_avx2(&cospi2, &bf1[16], &rounding, bit);
    bf1[16] = half_btf_0_avx2(&cospi62, &bf1[16], &rounding, bit);
    bf1[17] = half_btf_0_avx2(&cospim34, &bf1[30], &rounding, bit);
    bf1[30] = half_btf_0_avx2(&cospi30, &bf1[30], &rounding, bit);
    bf1[29] = half_btf_0_avx2(&cospi18, &bf1[18], &rounding, bit);
    bf1[18] = half_btf_0_avx2(&cospi46, &bf1[18], &rounding, bit);
    bf1[19] = half_btf_0_avx2(&cospim50, &bf1[28], &rounding, bit);
    bf1[28] = half_btf_0_avx2(&cospi14, &bf1[28], &rounding, bit);
    bf1[27] = half_btf_0_avx2(&cospi10, &bf1[20], &rounding, bit);
    bf1[20] = half_btf_0_avx2(&cospi54, &bf1[20], &rounding, bit);
    bf1[21] = half_btf_0_avx2(&cospim42, &bf1[26], &rounding, bit);
    bf1[26] = half_btf_0_avx2(&cospi22, &bf1[26], &rounding, bit);
    bf1[25] = half_btf_0_avx2(&cospi26, &bf1[22], &rounding, bit);
    bf1[22] = half_btf_0_avx2(&cospi38, &bf1[22], &rounding, bit);
    bf1[23] = half_btf_0_avx2(&cospim58, &bf1[24], &rounding, bit);
    bf1[24] = half_btf_0_avx2(&cospi6, &bf1[24], &rounding, bit);

    // stage 3
    bf1[15] = half_btf_0_avx2(&cospi4, &bf1[8], &rounding, bit);
    bf1[8] = half_btf_0_avx2(&cospi60, &bf1[8], &rounding, bit);
    bf1[9] = half_btf_0_avx2(&cospim36, &bf1[14], &rounding, bit);
    bf1[14] = half_btf_0_avx2(&cospi28, &bf1[14], &rounding, bit);
    bf1[13] = half_btf_0_avx2(&cospi20, &bf1[10], &rounding, bit);
    bf1[10] = half_btf_0_avx2(&cospi44, &bf1[10], &rounding, bit);
    bf1[11] = half_btf_0_avx2(&cospim52, &bf1[12], &rounding, bit);
    bf1[12] = half_btf_0_avx2(&cospi12, &bf1[12], &rounding, bit);

    addsub_avx2(bf1[16], bf1[17], bf1 + 16, bf1 + 17, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[19], bf1[18], bf1 + 19, bf1 + 18, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[20], bf1[21], bf1 + 20, bf1 + 21, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[23], bf1[22], bf1 + 23, bf1 + 22, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[24], bf1[25], bf1 + 24, bf1 + 25, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[27], bf1[26], bf1 + 27, bf1 + 26, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[28], bf1[29], bf1 + 28, bf1 + 29, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[31], bf1[30], bf1 + 31, bf1 + 30, &clamp_lo, &clamp_hi);

    // stage 4
    bf1[7] = half_btf_0_avx2(&cospi8, &bf1[4], &rounding, bit);
    bf1[4] = half_btf_0_avx2(&cospi56, &bf1[4], &rounding, bit);
    bf1[5] = half_btf_0_avx2(&cospim40, &bf1[6], &rounding, bit);
    bf1[6] = half_btf_0_avx2(&cospi24, &bf1[6], &rounding, bit);

    addsub_avx2(bf1[8], bf1[9], bf1 + 8, bf1 + 9, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[11], bf1[10], bf1 + 11, bf1 + 10, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[12], bf1[13], bf1 + 12, bf1 + 13, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[15], bf1[14], bf1 + 15, bf1 + 14, &clamp_lo, &clamp_hi);

    idct32_stage4_avx2(bf1, &cospim8, &cospi56, &cospi8, &cospim56, &cospim40,
                       &cospi24, &cospi40, &cospim24, &rounding, bit);

    // stage 5
    bf1[0] = half_btf_0_avx2(&cospi32, &bf1[0], &rounding, bit);
    bf1[1] = bf1[0];
    bf1[3] = half_btf_0_avx2(&cospi16, &bf1[2], &rounding, bit);
    bf1[2] = half_btf_0_avx2(&cospi48, &bf1[2], &rounding, bit);

    addsub_avx2(bf1[4], bf1[5], bf1 + 4, bf1 + 5, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[7], bf1[6], bf1 + 7, bf1 + 6, &clamp_lo, &clamp_hi);

    idct32_stage5_avx2(bf1, &cospim16, &cospi48, &cospi16, &cospim48, &clamp_lo,
                       &clamp_hi, &rounding, bit);

    // stage 6
    addsub_avx2(bf1[0], bf1[3], bf1 + 0, bf1 + 3, &clamp_lo, &clamp_hi);
    addsub_avx2(bf1[1], bf1[2], bf1 + 1, bf1 + 2, &clamp_lo, &clamp_hi);

    idct32_stage6_avx2(bf1, &cospim32, &cospi32, &cospim16, &cospi48, &cospi16,
                       &cospim48, &clamp_lo, &clamp_hi, &rounding, bit);

    // stage 7
    idct32_stage7_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 8
    idct32_stage8_avx2(bf1, &cospim32, &cospi32, &clamp_lo, &clamp_hi,
                       &rounding, bit);

    // stage 9
    idct32_stage9_avx2(bf1, out, do_cols, bd, out_shift, &clamp_lo, &clamp_hi);
  }
}